

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_bspline_bundle_tec(REF_INT degree,REF_INT n_control_point,REF_DBL *bundle,char *filename)

{
  size_t __size;
  double dVar1;
  double dVar2;
  REF_STATUS RVar3;
  FILE *__s;
  REF_DBL *control_points;
  REF_DBL *control_points_00;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  double t;
  REF_DBL uv [2];
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar7 = "unable to open file";
    uVar6 = 0x114f;
  }
  else {
    fwrite("title=\"refine bspine bundle\"\n",0x1d,1,__s);
    fwrite("variables = \"u\" \"v\" \"t\"\n",0x18,1,__s);
    if (n_control_point < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1154
             ,"ref_geom_bspline_bundle_tec","malloc u of REF_DBL negative");
      return 1;
    }
    __size = (ulong)(uint)n_control_point * 8;
    control_points = (REF_DBL *)malloc(__size);
    if (control_points == (REF_DBL *)0x0) {
      pcVar7 = "malloc u of REF_DBL NULL";
      uVar6 = 0x1154;
    }
    else {
      control_points_00 = (REF_DBL *)malloc(__size);
      if (control_points_00 != (REF_DBL *)0x0) {
        lVar4 = (long)(n_control_point + degree);
        for (lVar5 = 0; __size - lVar5 != 0; lVar5 = lVar5 + 8) {
          *(undefined8 *)((long)control_points + lVar5) =
               *(undefined8 *)((long)bundle + lVar5 * 2 + lVar4 * 8 + 8);
          *(undefined8 *)((long)control_points_00 + lVar5) =
               *(undefined8 *)((long)bundle + lVar5 * 2 + lVar4 * 8 + 0x10);
        }
        fprintf(__s,"zone t=\"control\", i=%d, datapacking=%s\n",(ulong)(uint)n_control_point,
                "point");
        for (uVar9 = 0; (uint)n_control_point != uVar9; uVar9 = uVar9 + 1) {
          fprintf(__s,"%f %f %f\n",control_points[uVar9],control_points_00[uVar9],
                  (double)(int)uVar9 / (double)(n_control_point + -1));
        }
        iVar8 = 0;
        fprintf(__s,"zone t=\"bundle\", i=%d, datapacking=%s\n",0x3e9,"point");
        dVar1 = *bundle;
        dVar2 = bundle[lVar4];
        while( true ) {
          if (iVar8 == 0x3e9) {
            free(control_points_00);
            free(control_points);
            fclose(__s);
            return 0;
          }
          t = ((double)iVar8 / 1000.0) * dVar2 + (1.0 - (double)iVar8 / 1000.0) * dVar1;
          RVar3 = ref_geom_bspline_eval(degree,n_control_point,bundle,t,control_points,uv);
          if (RVar3 != 0) break;
          RVar3 = ref_geom_bspline_eval(degree,n_control_point,bundle,t,control_points_00,uv + 1);
          if (RVar3 != 0) {
            uVar6 = 0x116c;
            goto LAB_0015571b;
          }
          fprintf(__s,"%f %f %f\n",uv[0],uv[1],t);
          iVar8 = iVar8 + 1;
        }
        uVar6 = 0x116a;
LAB_0015571b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar6,"ref_geom_bspline_bundle_tec",1,"eval");
        return 1;
      }
      pcVar7 = "malloc v of REF_DBL NULL";
      uVar6 = 0x1155;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
         "ref_geom_bspline_bundle_tec",pcVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_bundle_tec(REF_INT degree,
                                               REF_INT n_control_point,
                                               REF_DBL *bundle,
                                               const char *filename) {
  REF_INT i, n = 1001;
  REF_DBL t, t0, t1, s0, s1;
  REF_DBL *u, *v, uv[2], *knots;
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine bspine bundle\"\n");
  fprintf(file, "variables = \"u\" \"v\" \"t\"\n");

  ref_malloc(u, n_control_point, REF_DBL);
  ref_malloc(v, n_control_point, REF_DBL);
  knots = bundle;
  for (i = 0; i < n_control_point; i++) {
    u[i] = bundle[nknot + 0 + 2 * i];
    v[i] = bundle[nknot + 1 + 2 * i];
  }
  fprintf(file, "zone t=\"control\", i=%d, datapacking=%s\n", n_control_point,
          "point");
  for (i = 0; i < n_control_point; i++) {
    t = ((REF_DBL)i / ((REF_DBL)(n_control_point - 1)));
    fprintf(file, "%f %f %f\n", u[i], v[i], t);
  }

  fprintf(file, "zone t=\"bundle\", i=%d, datapacking=%s\n", n, "point");
  t0 = knots[0];
  t1 = knots[nknot - 1];
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * t0 + s1 * t1;
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, u, &(uv[0])),
        "eval");
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, v, &(uv[1])),
        "eval");
    fprintf(file, "%f %f %f\n", uv[0], uv[1], t);
  }
  ref_free(v);
  ref_free(u);
  fclose(file);
  return REF_SUCCESS;
}